

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,longlong value)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  type_conflict2 tVar1;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *ptVar2;
  value_type *pvVar3;
  uint64_t in_RSI;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  size_t in_stack_ffffffffffffff48;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff50;
  undefined4 local_68;
  int in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa0;
  size_t local_58;
  value_type_conflict in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1 [31];
  uint64_t local_18;
  
  tVar1 = internal::is_negative<long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    local_18 = -in_RSI;
  }
  internal::count_digits(local_18);
  ptVar2 = reserve(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (tVar1) {
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
              (&in_stack_ffffffffffffff50->out_,(int)(in_stack_ffffffffffffff48 >> 0x20));
    pvVar3 = internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator*
                       ((truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                        &stack0xffffffffffffffb8);
    *pvVar3 = '-';
  }
  out._1_31_ = in_stack_ffffffffffffffb1;
  out.super_truncating_iterator_base<char_*>.out_._0_1_ = in_stack_ffffffffffffffb0;
  internal::
  format_decimal<char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long>
            (out,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  (ptVar2->super_truncating_iterator_base<char_*>).out_ =
       (char *)CONCAT44(in_stack_ffffffffffffff9c,local_68);
  (ptVar2->super_truncating_iterator_base<char_*>).limit_ = in_stack_ffffffffffffffa0;
  (ptVar2->super_truncating_iterator_base<char_*>).count_ = local_58;
  ptVar2->blackhole_ = in_stack_ffffffffffffffb0;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }